

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_log_messages.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  Message MVar2;
  hrgls_Status hVar3;
  char *pcVar4;
  size_t sVar5;
  ostream *poVar6;
  long *plVar7;
  long lVar8;
  int iVar9;
  pointer copy;
  bool bVar10;
  timeval tVar11;
  timeval tVar12;
  API api;
  size_t count;
  Message m;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> messages;
  API local_b0;
  int local_a4;
  ulong local_a0;
  Message local_98;
  __time_t local_90;
  Message *local_88;
  vector<hrgls::Message,_std::allocator<hrgls::Message>_> local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,hrgls::ANONYMOUS_USER_abi_cxx11_,
             DAT_0010b2e8 + hrgls::ANONYMOUS_USER_abi_cxx11_);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_68,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)hrgls::NO_CREDENTIALS);
  hrgls::API::API(&local_b0,&local_50,&local_68);
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  hVar3 = hrgls::API::GetStatus(&local_b0);
  if (hVar3 == 0) {
    local_a0 = 0;
    hrgls::API::SetLogMessageCallback(&local_b0,HandleMessageCallback,&local_a0);
    hVar3 = hrgls::API::GetStatus(&local_b0);
    if (hVar3 == 0) {
      hrgls::API::SetLogMessageStreamingState(&local_b0,true);
      hVar3 = hrgls::API::GetStatus(&local_b0);
      if (hVar3 == 0) {
        tVar11 = hrgls::API::GetCurrentSystemTime(&local_b0);
        iVar9 = 0;
        do {
          if (4 < local_a0) {
            hrgls::API::SetLogMessageStreamingState(&local_b0,false);
            hVar3 = hrgls::API::GetStatus(&local_b0);
            if (hVar3 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Could not set streaming state off: ",0x23);
              pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
              std::endl<char,std::char_traits<char>>(poVar6);
              iVar9 = 5;
              goto LAB_0010564c;
            }
            hrgls::API::SetLogMessageCallback(&local_b0,(LogMessageCallback)0x0,(void *)0x0);
            hVar3 = hrgls::API::GetStatus(&local_b0);
            if (hVar3 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Could not reset callback handler: ",0x22);
              pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
              std::endl<char,std::char_traits<char>>(poVar6);
              iVar9 = 6;
              goto LAB_0010564c;
            }
            bVar10 = true;
            goto LAB_0010564e;
          }
          tVar12 = hrgls::API::GetCurrentSystemTime(&local_b0);
        } while (tVar12.tv_sec - tVar11.tv_sec < 6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Timeout waiting for callback-based messages.",0x2c);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
        std::ostream::put(-8);
        iVar9 = 4;
        std::ostream::flush();
LAB_0010564c:
        bVar10 = false;
LAB_0010564e:
        if (bVar10) {
          hrgls::API::SetLogMessageMinimumLevel(&local_b0,0);
          hVar3 = hrgls::API::GetStatus(&local_b0);
          if (hVar3 == 0) {
            hrgls::API::SetLogMessageStreamingState(&local_b0,true);
            hVar3 = hrgls::API::GetStatus(&local_b0);
            if (hVar3 == 0) {
              local_a0 = 0;
              tVar11 = hrgls::API::GetCurrentSystemTime(&local_b0);
              local_90 = tVar11.tv_sec;
              do {
                hrgls::API::GetPendingLogMessages(&local_80,&local_b0,0);
                hVar3 = hrgls::API::GetStatus(&local_b0);
                if (hVar3 == 1) {
LAB_001058b1:
                  tVar11 = hrgls::API::GetCurrentSystemTime(&local_b0);
                  lVar8 = tVar11.tv_sec - local_90;
                  bVar10 = lVar8 < 6;
                  if (5 < lVar8) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Timeout waiting for get-based messages.",0x27)
                    ;
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                    iVar9 = 9;
                    goto LAB_0010592e;
                  }
                }
                else {
                  if (hVar3 == 0) {
                    local_a0 = local_a0 +
                               ((long)local_80.
                                      super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_80.
                                      super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3);
                    local_88 = local_80.
                               super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                               _M_impl.super__Vector_impl_data._M_finish;
                    bVar10 = local_80.
                             super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                             _M_impl.super__Vector_impl_data._M_finish ==
                             local_80.
                             super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                    copy = local_80.
                           super__Vector_base<hrgls::Message,_std::allocator<hrgls::Message>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                    while (!bVar10) {
                      hrgls::Message::Message(&local_98,copy);
                      MVar2.m_private = local_98.m_private;
                      local_a4 = 0;
                      if ((local_98.m_private)->Message == (hrgls_Message)0x0) {
                        hVar3 = 0x3ee;
                      }
                      else {
                        hVar3 = hrgls_MessageGetLevel();
                      }
                      iVar1 = local_a4;
                      (MVar2.m_private)->status = hVar3;
                      if (local_a4 < 0) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"Too-low message level: ",0x17);
                        local_a4 = 0;
                        if ((MVar2.m_private)->Message == (hrgls_Message)0x0) {
                          hVar3 = 0x3ee;
                        }
                        else {
                          hVar3 = hrgls_MessageGetLevel((MVar2.m_private)->Message,&local_a4);
                        }
                        (MVar2.m_private)->status = hVar3;
                        plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cerr,local_a4);
                        std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
                        std::ostream::put((char)plVar7);
                        iVar9 = 0x65;
                        std::ostream::flush();
                      }
                      hrgls::Message::~Message(&local_98);
                      if (iVar1 < 0) break;
                      copy = copy + 1;
                      bVar10 = copy == local_88;
                    }
                    if (bVar10) goto LAB_001058b1;
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"Error reading messages: ",0x18);
                    pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
                    if (pcVar4 == (char *)0x0) {
                      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c2f8);
                    }
                    else {
                      sVar5 = strlen(pcVar4);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,pcVar4,sVar5);
                    }
                    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
                    std::ostream::put(-8);
                    std::ostream::flush();
                    iVar9 = 8;
                  }
LAB_0010592e:
                  bVar10 = false;
                }
                std::vector<hrgls::Message,_std::allocator<hrgls::Message>_>::~vector(&local_80);
                if (!bVar10) goto LAB_001059ac;
              } while (local_a0 < 5);
              hrgls::API::SetLogMessageStreamingState(&local_b0,false);
              hVar3 = hrgls::API::GetStatus(&local_b0);
              if (hVar3 == 0) {
                bVar10 = true;
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Could not set streaming state off: ",0x23);
                pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
                poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
                std::endl<char,std::char_traits<char>>(poVar6);
                iVar9 = 10;
LAB_001059ac:
                bVar10 = false;
              }
              if (bVar10) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Success!",8);
                iVar9 = 0;
                std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Could not set streaming state on: ",0x22);
              pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
              poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
              iVar9 = 7;
              std::endl<char,std::char_traits<char>>(poVar6);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Could not set minimum message level: ",0x25);
            pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
            poVar6 = std::operator<<((ostream *)&std::cerr,pcVar4);
            iVar9 = 100;
            std::endl<char,std::char_traits<char>>(poVar6);
          }
        }
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Could not set streaming state on: ",0x22);
        pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
        if (pcVar4 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c2f8);
        }
        else {
          sVar5 = strlen(pcVar4);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
        std::ostream::put(-8);
        iVar9 = 3;
        std::ostream::flush();
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not set callback handler: ",0x20);
      pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
      if (pcVar4 == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c2f8);
      }
      else {
        sVar5 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
      std::ostream::put(-8);
      iVar9 = 2;
      std::ostream::flush();
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Could not Open API: ",0x14);
    pcVar4 = (char *)hrgls_ErrorMessage(hVar3);
    if (pcVar4 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10c2f8);
    }
    else {
      sVar5 = strlen(pcVar4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar5);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    iVar9 = 1;
    std::ostream::flush();
  }
  hrgls::API::~API(&local_b0);
  return iVar9;
}

Assistant:

int main(int argc, const char *argv[])
{
  // Get a base API object and, specifying default parameters.
  hrgls::API api;
  hrgls_Status status = api.GetStatus();
  if (status != hrgls_STATUS_OKAY) {
    std::cerr << "Could not Open API: "
      << hrgls_ErrorMessage(status) << std::endl;
    return 1;
  }

  size_t count = 0;
  { /// Read messages using a callback handler.

    // Set a callback handler for incoming messages and then start streaming.
    api.SetLogMessageCallback(HandleMessageCallback, &count);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set callback handler: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 2;
    }
    api.SetLogMessageStreamingState(true);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state on: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 3;
    }

    // Run until we have 5 messages or we time out.
    struct timeval start = api.GetCurrentSystemTime();
    while (count < 5) {
      struct timeval now = api.GetCurrentSystemTime();
      if (now.tv_sec - start.tv_sec > 5) {
        std::cerr << "Timeout waiting for callback-based messages." << std::endl;
        return 4;
      }
    };

    // Unhook the callback handler after stopping the stream.
    api.SetLogMessageStreamingState(false);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state off: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 5;
    }
    api.SetLogMessageCallback(nullptr, nullptr);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not reset callback handler: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 6;
    }
  }

  // Set a minimum threshold for the messages at warning for the
  // get-based test and ensure that we don't get any messages with
  // lower level than that.

  api.SetLogMessageMinimumLevel(hrgls_MESSAGE_MINIMUM_WARNING);
  status = api.GetStatus();
  if (status != hrgls_STATUS_OKAY) {
    std::cerr << "Could not set minimum message level: "
      << hrgls_ErrorMessage(status) << std::endl;
    return 100;
  }

  { /// Read the message without a callback handler.

    // Start streaming
    api.SetLogMessageStreamingState(true);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state on: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 7;
    }

    count = 0;
    struct timeval start = api.GetCurrentSystemTime();
    do {
      std::vector<hrgls::Message> messages = api.GetPendingLogMessages();
      hrgls_Status status = api.GetStatus();
      if (hrgls_STATUS_OKAY == status) {
        count += messages.size();
        // Make sure we didn't get any messages below the minimum level.
        for (auto m : messages) {
          if (m.Level() < hrgls_MESSAGE_MINIMUM_WARNING) {
            std::cerr << "Too-low message level: " << m.Level() << std::endl;
            return 101;
          }
        }
      } else if (status != hrgls_STATUS_TIMEOUT) {
        std::cerr << "Error reading messages: " << hrgls_ErrorMessage(status) << std::endl;
        return 8;
      }

      struct timeval now = api.GetCurrentSystemTime();
      if (now.tv_sec - start.tv_sec > 5) {
        std::cerr << "Timeout waiting for get-based messages." << std::endl;
        return 9;
      }

    } while (count < 5);

    // Stop streaming
    api.SetLogMessageStreamingState(false);
    status = api.GetStatus();
    if (status != hrgls_STATUS_OKAY) {
      std::cerr << "Could not set streaming state off: "
        << hrgls_ErrorMessage(status) << std::endl;
      return 10;
    }
  }

  std::cout << "Success!" << std::endl;
  return 0;
}